

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O0

string * formatBytes_abi_cxx11_(string *__return_storage_ptr__,size_t bytes)

{
  undefined4 uVar1;
  undefined4 uVar5;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  allocator<char> local_59;
  string local_58;
  char local_38 [8];
  char formatted [24];
  size_t bytes_local;
  
  uVar1 = (undefined4)bytes;
  uVar5 = (undefined4)(bytes >> 0x20);
  if (bytes < 995000000) {
    if (bytes < 0xf2eb8) {
      if (bytes < 0x3e3) {
        snprintf(local_38,0x18,"%d B",bytes & 0xffffffff);
      }
      else {
        auVar4._8_4_ = uVar5;
        auVar4._0_8_ = bytes;
        auVar4._12_4_ = 0x45300000;
        snprintf(local_38,0x18,"%.1f KiB",
                 ((auVar4._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) / 1000.0);
      }
    }
    else {
      auVar3._8_4_ = uVar5;
      auVar3._0_8_ = bytes;
      auVar3._12_4_ = 0x45300000;
      snprintf(local_38,0x18,"%.1f MiB",
               ((auVar3._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) / 1000000.0);
    }
  }
  else {
    auVar2._8_4_ = uVar5;
    auVar2._0_8_ = bytes;
    auVar2._12_4_ = 0x45300000;
    snprintf(local_38,0x18,"%.1f GiB",
             ((auVar2._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,uVar1) - 4503599627370496.0)) / 1000000000.0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,local_38,&local_59);
  commify(__return_storage_ptr__,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return __return_storage_ptr__;
}

Assistant:

std::string formatBytes (size_t bytes)
{
  char formatted[24];

       if (bytes >=  995000000) snprintf (formatted, sizeof(formatted), "%.1f GiB", bytes / 1000000000.0);
  else if (bytes >=     995000) snprintf (formatted, sizeof(formatted), "%.1f MiB", bytes /    1000000.0);
  else if (bytes >=        995) snprintf (formatted, sizeof(formatted), "%.1f KiB", bytes /       1000.0);
  else                          snprintf (formatted, sizeof(formatted), "%d B",     (int)bytes);

  return commify (formatted);
}